

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void __thiscall
Js::DynamicProfileInfo::SetFunctionIdSlotForNewPolymorphicCall
          (DynamicProfileInfo *this,ProfileId callSiteId,LocalFunctionId curFunctionId,
          SourceId curSourceId,FunctionBody *inliner)

{
  LocalFunctionId LVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  char16 *pcVar5;
  long lVar6;
  undefined6 in_register_00000032;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  lVar2 = *(long *)((long)&((this->callSiteInfo).ptr)->u +
                   (ulong)(uint)((int)CONCAT62(in_register_00000032,callSiteId) << 4));
  lVar6 = -4;
  while( true ) {
    if (lVar6 == 0) {
      bVar3 = Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
      if (bVar3) {
        iVar4 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
        pcVar5 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)inliner,(wchar (*) [42])local_88)
        ;
        Output::Print(L"INLINING (Polymorphic): More than 4 functions at this call site \t callSiteId: %d\t calleeFunctionId: %d TopFunc %s (%s)\n"
                      ,callSiteId,(ulong)curFunctionId,CONCAT44(extraout_var,iVar4),pcVar5);
        Output::Flush();
      }
      bVar3 = Phases::IsEnabled((Phases *)&DAT_01453738,PerfHintPhase);
      if (bVar3) {
        WritePerfHint(PolymorphicInilineCap,inliner,0xffffffff);
      }
      ResetPolymorphicCallSiteInfo(this,callSiteId,0xffffffff);
      return;
    }
    LVar1 = *(LocalFunctionId *)(lVar2 + 0x10 + lVar6 * 4);
    if ((LVar1 == curFunctionId) && (*(SourceId *)(lVar2 + 0x20 + lVar6 * 4) == curSourceId)) break;
    lVar6 = lVar6 + 1;
    if (LVar1 == 0xfffffffc) {
      *(LocalFunctionId *)(lVar2 + 0xc + lVar6 * 4) = curFunctionId;
      *(SourceId *)(lVar2 + 0x1c + lVar6 * 4) = curSourceId;
      this->currentInlinerVersion = this->currentInlinerVersion + '\x01';
      return;
    }
  }
  return;
}

Assistant:

void DynamicProfileInfo::SetFunctionIdSlotForNewPolymorphicCall(ProfileId callSiteId, Js::LocalFunctionId curFunctionId, Js::SourceId curSourceId, Js::FunctionBody *inliner)
    {
        for (int i = 0; i < maxPolymorphicInliningSize; i++)
        {
            if (callSiteInfo[callSiteId].u.polymorphicCallSiteInfo->functionIds[i] == curFunctionId &&
                callSiteInfo[callSiteId].u.polymorphicCallSiteInfo->sourceIds[i] == curSourceId)
            {
                // we have it already
                return;
            }
            else if (callSiteInfo[callSiteId].u.polymorphicCallSiteInfo->functionIds[i] == CallSiteNoInfo)
            {
                callSiteInfo[callSiteId].u.polymorphicCallSiteInfo->functionIds[i] = curFunctionId;
                callSiteInfo[callSiteId].u.polymorphicCallSiteInfo->sourceIds[i] = curSourceId;
                this->currentInlinerVersion++;
                return;
            }
        }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::PolymorphicInlinePhase))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

            Output::Print(_u("INLINING (Polymorphic): More than 4 functions at this call site \t callSiteId: %d\t calleeFunctionId: %d TopFunc %s (%s)\n"),
                callSiteId,
                curFunctionId,
                inliner->GetDisplayName(),
                inliner->GetDebugNumberSet(debugStringBuffer)
                );
            Output::Flush();
        }
#endif

#ifdef PERF_HINT
        if (PHASE_TRACE1(Js::PerfHintPhase))
        {
            WritePerfHint(PerfHints::PolymorphicInilineCap, inliner);
        }
#endif

        // We reached the max allowed to inline, no point in continuing collecting the information. Reset and move on.
        ResetPolymorphicCallSiteInfo(callSiteId, CallSiteMixed);
    }